

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

ValueIterator __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert_to_bucket
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val,
          size_t *bucketIdx)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  size_t sVar1;
  long lVar2;
  long lVar3;
  iterator iVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  sVar1 = this->mSize;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  lVar2 = (long)(this->mBuckets).
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mBuckets).
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  lVar3 = lVar2 * -0x5555555555555555;
  auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar7._0_8_ = lVar3;
  auVar7._12_4_ = 0x45300000;
  fVar5 = (float)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
  if (this->mMaxLoadFactor <= fVar5 && fVar5 != this->mMaxLoadFactor) {
    rehash(this,lVar2 * 0x5555555555555556);
    *bucketIdx = (ulong)(long)val->first %
                 (ulong)(((long)(this->mBuckets).
                                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->mBuckets).
                                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555);
  }
  this->mSize = this->mSize + 1;
  this_00 = (this->mBuckets).
            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + *bucketIdx;
  iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                    (this_00,(this_00->
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,val);
  return (ValueIterator)iVar4._M_current;
}

Assistant:

ValueIterator insert_to_bucket(const ValueT& val, size_t& bucketIdx) {
      if (load_factor() > max_load_factor()) {
        rehash(2*bucket_count());
        bucketIdx = hash_to_bucket(val.first); // bucket size change after rehash
      }
      ++mSize;
      return mBuckets[bucketIdx].insert(mBuckets[bucketIdx].end(), val);
    }